

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedLargeStrideAndOffsetsNewAndLegacyAPI::Run
          (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  void *pvVar2;
  undefined4 *data;
  float *pfVar3;
  long lVar4;
  char *glsl_vs;
  char *local_28;
  
  local_28 = 
  "#version 430 core\nlayout(location = 0) in vec2 vs_in_attrib0;\nlayout(location = 4) in ivec2 vs_in_attrib1;\nlayout(location = 8) in uvec2 vs_in_attrib2;\nlayout(location = 15) in float vs_in_attrib3;\nlayout(std430, binding = 1) buffer Output {\n  vec2 attrib0[4];\n  ivec2 attrib1[4];\n  uvec2 attrib2[4];\n  float attrib3[4];\n} g_output;\nvoid main() {\n  g_output.attrib0[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib0;\n  g_output.attrib1[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib1;\n  g_output.attrib2[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib2;\n  g_output.attrib3[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib3;\n}"
  ;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,1,&local_28);
  this->m_vsp = program;
  bVar1 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,program);
  lVar4 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,1,this->m_vsp);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,100000,(void *)0x0,0x88e4);
    pvVar2 = glu::CallLogWrapper::glMapBuffer(this_00,0x8892,0x88b9);
    *(undefined8 *)((long)pvVar2 + 0x10) = 0x400000003f800000;
    *(undefined8 *)((long)pvVar2 + 0x810) = 0x4080000040400000;
    *(undefined1 **)((long)pvVar2 + 0x80) = &DAT_600000005;
    *(undefined8 *)((long)pvVar2 + 0x880) = 0x800000007;
    *(undefined8 *)((long)pvVar2 + 0x400) = 0xa00000009;
    *(undefined8 *)((long)pvVar2 + 0xc00) = 0xc0000000b;
    *(undefined4 *)((long)pvVar2 + 0x7f0) = 0x41500000;
    *(undefined4 *)((long)pvVar2 + 0xff0) = 0x41600000;
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x8892);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
    glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1406,'\0',0x10);
    glu::CallLogWrapper::glVertexAttribIFormat(this_00,8,2,0x1405,0x400);
    glu::CallLogWrapper::glVertexAttribFormat(this_00,0xf,1,0x1406,'\0',0x7f0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
    glu::CallLogWrapper::glVertexAttribIPointer(this_00,4,2,0x1404,0x800,(void *)0x80);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glVertexAttribBinding(this_00,8,3);
    glu::CallLogWrapper::glVertexAttribBinding(this_00,0xf,3);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0x800);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,3,this->m_vbo,0,0x800);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,4);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,8);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0xf);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    data = (undefined4 *)operator_new(0x70);
    *data = 0xffffffff;
    data[1] = 0xffffffff;
    data[2] = 0xffffffff;
    data[3] = 0xffffffff;
    data[4] = 0xffffffff;
    data[5] = 0xffffffff;
    data[6] = 0xffffffff;
    data[7] = 0xffffffff;
    data[8] = 0xffffffff;
    data[9] = 0xffffffff;
    data[10] = 0xffffffff;
    data[0xb] = 0xffffffff;
    data[0xc] = 0xffffffff;
    data[0xd] = 0xffffffff;
    data[0xe] = 0xffffffff;
    data[0xf] = 0xffffffff;
    data[0x10] = 0xffffffff;
    data[0x11] = 0xffffffff;
    data[0x12] = 0xffffffff;
    data[0x13] = 0xffffffff;
    data[0x14] = 0xffffffff;
    data[0x15] = 0xffffffff;
    data[0x16] = 0xffffffff;
    data[0x17] = 0xffffffff;
    data[0x18] = 0xffffffff;
    data[0x19] = 0xffffffff;
    data[0x1a] = 0xffffffff;
    data[0x1b] = 0xffffffff;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_ssbo);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x70,data,0x88e8);
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_ppo);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
    glu::CallLogWrapper::glDrawArraysInstanced(this_00,0,0,2,2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_ssbo);
    pfVar3 = (float *)glu::CallLogWrapper::glMapBuffer(this_00,0x90d2,35000);
    lVar4 = -1;
    if (((((*pfVar3 == 1.0) && (!NAN(*pfVar3))) && (pfVar3[1] == 2.0)) &&
        ((((!NAN(pfVar3[1]) && (pfVar3[2] == 3.0)) &&
          ((!NAN(pfVar3[2]) && ((pfVar3[3] == 4.0 && (!NAN(pfVar3[3]))))))) && (pfVar3[4] == 1.0))))
       && ((((((!NAN(pfVar3[4]) && (pfVar3[5] == 2.0)) && (!NAN(pfVar3[5]))) &&
             ((pfVar3[6] == 3.0 && (!NAN(pfVar3[6]))))) &&
            ((pfVar3[7] == 4.0 && ((!NAN(pfVar3[7]) && (pfVar3[8] == 7.00649e-45)))))) &&
           (((((pfVar3[9] == 8.40779e-45 &&
               (((((pfVar3[10] == 9.80909e-45 && (pfVar3[0xb] == 1.12104e-44)) &&
                  (pfVar3[0xc] == 7.00649e-45)) &&
                 ((pfVar3[0xd] == 8.40779e-45 && (pfVar3[0xe] == 9.80909e-45)))) &&
                (pfVar3[0xf] == 1.12104e-44)))) &&
              (((pfVar3[0x10] == 1.26117e-44 && (pfVar3[0x11] == 1.4013e-44)) &&
               ((pfVar3[0x12] == 1.54143e-44 &&
                (((pfVar3[0x13] == 1.68156e-44 && (pfVar3[0x14] == 1.26117e-44)) &&
                 (pfVar3[0x15] == 1.4013e-44)))))))) &&
             (((pfVar3[0x16] == 1.54143e-44 && (pfVar3[0x17] == 1.68156e-44)) &&
              (pfVar3[0x18] == 13.0)))) &&
            ((((!NAN(pfVar3[0x18]) && (pfVar3[0x19] == 14.0)) &&
              ((!NAN(pfVar3[0x19]) &&
               (((pfVar3[0x1a] == 13.0 && (!NAN(pfVar3[0x1a]))) && (pfVar3[0x1b] == 14.0)))))) &&
             (!NAN(pfVar3[0x1b]))))))))) {
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      lVar4 = 0;
    }
    operator_delete(data,0x70);
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 430 core" NL "layout(location = 0) in vec2 vs_in_attrib0;" NL
			"layout(location = 4) in ivec2 vs_in_attrib1;" NL "layout(location = 8) in uvec2 vs_in_attrib2;" NL
			"layout(location = 15) in float vs_in_attrib3;" NL "layout(std430, binding = 1) buffer Output {" NL
			"  vec2 attrib0[4];" NL "  ivec2 attrib1[4];" NL "  uvec2 attrib2[4];" NL "  float attrib3[4];" NL
			"} g_output;" NL "void main() {" NL
			"  g_output.attrib0[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib0;" NL
			"  g_output.attrib1[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib1;" NL
			"  g_output.attrib2[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib2;" NL
			"  g_output.attrib3[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib3;" NL "}";
		m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		if (!CheckProgram(m_vsp))
			return ERROR;
		glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);

		{
			glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
			glBufferData(GL_ARRAY_BUFFER, 100000, NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY));

			*reinterpret_cast<Vec2*>(&ptr[16 + 0 * 2048])	= Vec2(1.0f, 2.0f);
			*reinterpret_cast<Vec2*>(&ptr[16 + 1 * 2048])	= Vec2(3.0f, 4.0f);
			*reinterpret_cast<IVec2*>(&ptr[128 + 0 * 2048])  = IVec2(5, 6);
			*reinterpret_cast<IVec2*>(&ptr[128 + 1 * 2048])  = IVec2(7, 8);
			*reinterpret_cast<UVec2*>(&ptr[1024 + 0 * 2048]) = UVec2(9, 10);
			*reinterpret_cast<UVec2*>(&ptr[1024 + 1 * 2048]) = UVec2(11, 12);
			*reinterpret_cast<float*>(&ptr[2032 + 0 * 2048]) = 13.0f;
			*reinterpret_cast<float*>(&ptr[2032 + 1 * 2048]) = 14.0f;

			glUnmapBuffer(GL_ARRAY_BUFFER);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribIFormat(8, 2, GL_UNSIGNED_INT, 1024);
		glVertexAttribFormat(15, 1, GL_FLOAT, GL_FALSE, 2032);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glVertexAttribIPointer(4, 2, GL_INT, 2048, reinterpret_cast<void*>(128));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glVertexAttribBinding(8, 3);
		glVertexAttribBinding(15, 3);
		glBindVertexBuffer(0, m_vbo, 0, 2048);
		glBindVertexBuffer(3, m_vbo, 0, 2048);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(4);
		glEnableVertexAttribArray(8);
		glEnableVertexAttribArray(15);
		glBindVertexArray(0);

		std::vector<GLubyte> data((sizeof(Vec2) + sizeof(IVec2) + sizeof(UVec2) + sizeof(float)) * 4, 0xff);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_ssbo);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)data.size(), &data[0], GL_DYNAMIC_DRAW);

		glEnable(GL_RASTERIZER_DISCARD);
		glBindProgramPipeline(m_ppo);
		glBindVertexArray(m_vao);
		glDrawArraysInstanced(GL_POINTS, 0, 2, 2);

		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBuffer(GL_SHADER_STORAGE_BUFFER, GL_READ_ONLY));

			Vec2 i0_v0_a0 = *reinterpret_cast<Vec2*>(&ptr[0]);
			Vec2 i0_v1_a0 = *reinterpret_cast<Vec2*>(&ptr[8]);
			Vec2 i1_v0_a0 = *reinterpret_cast<Vec2*>(&ptr[16]);
			Vec2 i1_v1_a0 = *reinterpret_cast<Vec2*>(&ptr[24]);

			if (!IsEqual(i0_v0_a0, Vec2(1.0f, 2.0f)))
				return ERROR;
			if (!IsEqual(i0_v1_a0, Vec2(3.0f, 4.0f)))
				return ERROR;
			if (!IsEqual(i1_v0_a0, Vec2(1.0f, 2.0f)))
				return ERROR;
			if (!IsEqual(i1_v1_a0, Vec2(3.0f, 4.0f)))
				return ERROR;

			IVec2 i0_v0_a1 = *reinterpret_cast<IVec2*>(&ptr[32]);
			IVec2 i0_v1_a1 = *reinterpret_cast<IVec2*>(&ptr[40]);
			IVec2 i1_v0_a1 = *reinterpret_cast<IVec2*>(&ptr[48]);
			IVec2 i1_v1_a1 = *reinterpret_cast<IVec2*>(&ptr[56]);

			if (!IsEqual(i0_v0_a1, IVec2(5, 6)))
				return ERROR;
			if (!IsEqual(i0_v1_a1, IVec2(7, 8)))
				return ERROR;
			if (!IsEqual(i1_v0_a1, IVec2(5, 6)))
				return ERROR;
			if (!IsEqual(i1_v1_a1, IVec2(7, 8)))
				return ERROR;

			UVec2 i0_v0_a2 = *reinterpret_cast<UVec2*>(&ptr[64]);
			UVec2 i0_v1_a2 = *reinterpret_cast<UVec2*>(&ptr[72]);
			UVec2 i1_v0_a2 = *reinterpret_cast<UVec2*>(&ptr[80]);
			UVec2 i1_v1_a2 = *reinterpret_cast<UVec2*>(&ptr[88]);

			if (!IsEqual(i0_v0_a2, UVec2(9, 10)))
				return ERROR;
			if (!IsEqual(i0_v1_a2, UVec2(11, 12)))
				return ERROR;
			if (!IsEqual(i1_v0_a2, UVec2(9, 10)))
				return ERROR;
			if (!IsEqual(i1_v1_a2, UVec2(11, 12)))
				return ERROR;

			float i0_v0_a3 = *reinterpret_cast<float*>(&ptr[96]);
			float i0_v1_a3 = *reinterpret_cast<float*>(&ptr[100]);
			float i1_v0_a3 = *reinterpret_cast<float*>(&ptr[104]);
			float i1_v1_a3 = *reinterpret_cast<float*>(&ptr[108]);

			if (i0_v0_a3 != 13.0f)
				return ERROR;
			if (i0_v1_a3 != 14.0f)
				return ERROR;
			if (i1_v0_a3 != 13.0f)
				return ERROR;
			if (i1_v1_a3 != 14.0f)
				return ERROR;
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		return NO_ERROR;
	}